

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvtable.h
# Opt level: O2

ssize_t __thiscall
CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::write
          (CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  ostream *in_RAX;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint i;
  uint i_00;
  undefined4 in_register_00000034;
  ostream *poVar3;
  char *pcVar4;
  pointer pCVar5;
  
  poVar3 = (ostream *)CONCAT44(in_register_00000034,__fd);
  pcVar4 = "";
  for (pCVar5 = (this->columns).
                super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 != (this->columns).
                super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
    poVar1 = std::operator<<(poVar3,pcVar4);
    in_RAX = std::operator<<(poVar1,(string *)pCVar5);
    pcVar4 = ",";
  }
  for (i_00 = 0; i_00 < this->nrows; i_00 = i_00 + 1) {
    in_RAX = std::endl<char,std::char_traits<char>>(poVar3);
    pcVar4 = "";
    for (pCVar5 = (this->columns).
                  super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar5 != (this->columns).
                  super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
      poVar1 = std::operator<<(poVar3,pcVar4);
      pbVar2 = CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](pCVar5,i_00);
      in_RAX = std::operator<<(poVar1,(string *)pbVar2);
      pcVar4 = ",";
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void write(std::ostream& os) const
  {
    const char* comma = "";
    typename std::vector<CSVTableColumn<Tvar> >::const_iterator it;

    for (it = columns.begin(); it != columns.end(); it++) {
      os << comma << it->getHeader();
      comma = ",";
    }

    for (unsigned i=0; i < nrows; i++) {
      comma = "";
      os << std::endl;
      for (it = columns.begin(); it != columns.end(); it++) {
	os << comma << (*it)[i];
	comma = ",";
      }
    }
  }